

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffglkut(fitsfile *fptr,char *keyname,int firstchar,int maxvalchar,int maxcomchar,char *value,
           int *valuelen,char *comm,int *comlen,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  char comstring [73];
  char valstring [71];
  char card [81];
  char *local_168;
  int local_15c;
  size_t local_158;
  uint local_14c;
  uint local_148;
  int local_144;
  char *local_140;
  int local_134;
  uint local_130;
  int local_12c;
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_144 = 0;
  local_15c = 1;
  iVar1 = *status;
  if (iVar1 < 1) {
    if (value != (char *)0x0) {
      *value = '\0';
    }
    if (comm != (char *)0x0) {
      *comm = '\0';
    }
    *valuelen = 0;
    *comlen = 0;
    local_88[0] = '\0';
    local_d8[0] = '\0';
    local_128[0] = '\0';
    local_148 = maxvalchar;
    local_12c = firstchar;
    ffgcrd(fptr,keyname,local_88,status);
    iVar1 = *status;
    if (iVar1 < 1) {
      ffpsvc(local_88,local_d8,local_128,status);
      iVar1 = *status;
      if (iVar1 < 1) {
        uVar6 = maxcomchar | local_148;
        sVar2 = strlen(local_88);
        bVar7 = local_128[0] != '\0';
        local_134 = maxcomchar;
        local_130 = uVar6;
        if ((uVar6 == 0) && (ffghps(fptr,(int *)0x0,&local_15c,status), 1 < local_15c)) {
          local_15c = local_15c + -1;
        }
        if (local_d8[0] == '\0') {
          pcVar3 = (char *)malloc(1);
          *pcVar3 = '\0';
          local_168 = (char *)malloc(1);
          *local_168 = '\0';
        }
        else {
          local_14c = (uint)(sVar2 < 0x50 && bVar7);
          sVar2 = strlen(local_d8);
          pcVar3 = (char *)malloc(sVar2 + 1);
          ffc2s(local_d8,pcVar3,status);
          sVar2 = strlen(pcVar3);
          sVar4 = strlen(local_128);
          local_168 = (char *)malloc(sVar4 + 1);
          *local_168 = '\0';
          strcpy(local_168,local_128);
          local_158 = strlen(local_168);
          do {
            if (0 < *status) break;
            bVar7 = true;
            if ((sVar2 != 0) && (pcVar3[sVar2 - 1] == '&')) {
              local_d8[0] = '\0';
              local_128[0] = '\0';
              local_140 = pcVar3;
              ffgcnt(fptr,local_d8,local_128,status);
              pcVar3 = local_140;
              bVar7 = true;
              if (local_128[0] != '\0' || local_d8[0] != '\0') {
                local_140[sVar2 - 1] = '\0';
                sVar4 = sVar2 - 1;
                if (local_d8[0] != '\0') {
                  sVar5 = strlen(local_d8);
                  sVar4 = sVar4 + sVar5;
                  local_140 = (char *)realloc(pcVar3,sVar2 + sVar5);
                  strcat(local_140,local_d8);
                }
                if (local_128[0] != '\0') {
                  sVar2 = strlen(local_128);
                  if (local_14c == 0) {
                    sVar5 = sVar2 + local_158;
                    local_168 = (char *)realloc(local_168,sVar2 + local_158 + 1);
                  }
                  else {
                    sVar5 = local_158 + sVar2 + 1;
                    local_168 = (char *)realloc(local_168,local_158 + sVar2 + 2);
                    sVar2 = strlen(local_168);
                    (local_168 + sVar2)[0] = ' ';
                    (local_168 + sVar2)[1] = '\0';
                  }
                  local_158 = sVar5;
                  strcat(local_168,local_128);
                }
                ffghps(fptr,(int *)0x0,&local_144,status);
                ffgrec(fptr,local_144 + -1,local_88,status);
                sVar2 = strlen(local_88);
                local_14c = (uint)(local_158 != 0 && sVar2 < 0x50);
                sVar2 = sVar4;
                pcVar3 = local_140;
                bVar7 = false;
              }
            }
          } while (!bVar7);
        }
        sVar2 = strlen(pcVar3);
        sVar4 = strlen(local_168);
        *valuelen = (int)sVar2;
        *comlen = (int)sVar4;
        if (local_130 == 0) {
          ffmaky(fptr,local_15c,status);
        }
        else {
          if ((value != (char *)0x0) && ((ulong)(long)local_12c <= sVar2)) {
            strncat(value,pcVar3 + ((long)local_12c - 1),(long)(int)local_148);
          }
          if (comm != (char *)0x0) {
            strncat(comm,local_168,(long)local_134);
          }
        }
        free(pcVar3);
        free(local_168);
        iVar1 = *status;
      }
    }
  }
  return iVar1;
}

Assistant:

int ffglkut( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxvalchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           int maxcomchar,      /* I - maximum length of comment to return */
           char *value,         /* O - pointer to keyword value (may be NULL) */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxvalchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int *comlen,         /* O - total length of comment string */
           int  *status)        /* IO - error status                 */
{
    char valstring[FLEN_VALUE], comstring[FLEN_COMMENT], card[FLEN_CARD];
    char *dynValStr=0, *dynComStr=0;
    int contin, addCommDelim=0, keynum=0;
    int lenOnly=0, savedKeyPos=1;
    size_t len=0, lenc=0;

    if (*status > 0)
        return(*status);

    if (maxvalchar==0 && maxcomchar==0)
       lenOnly = 1;
    
    if (value)
       *value = '\0';
    if (comm)
       *comm = '\0';
    /* If lenOnly, 'value' and 'comm' should not be accessed after this point.*/
    
    *valuelen = 0; 
    *comlen = 0;   
    card[0] = '\0';
    valstring[0] = '\0';
    comstring[0] = '\0';
       
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    ffpsvc(card,valstring, comstring, status);    
    if (*status > 0)
        return(*status);
    if (strlen(card) < FLEN_CARD-1 && *comstring)
       addCommDelim=1;
        
    /* If called in lenOnly mode, there's a good chance the user will soon call
       this again to read the value string.  Therefore we'll save and later restore
       the original keyword position. */
    if (lenOnly)
    {
       ffghps(fptr, 0, &savedKeyPos, status);
       if (savedKeyPos > 1)
          savedKeyPos -= 1;
    }

    if (!valstring[0])   /* null value string? */
    {
      dynValStr = (char *) malloc(1);  /* allocate and return a null string */
      *dynValStr = '\0';      
      dynComStr = (char *)malloc(1);
      *dynComStr= '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      dynValStr = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, dynValStr, status);   /* convert string to value */
      len = strlen(dynValStr);
      
      dynComStr = (char *) malloc(strlen(comstring)+1);
      dynComStr[0]=0;
      strcpy(dynComStr, comstring);
      lenc = strlen(dynComStr);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(dynValStr+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            comstring[0] = '\0';
            ffgcnt(fptr, valstring, comstring, status);
            if (*valstring || *comstring)  /* If either valstring or comstring
                                  is filled, this must be a CONTINUE line */  
            {
               *(dynValStr+len-1) = '\0';         /* erase the trailing & char */
               len -= 1;
               if (*valstring)
               {
                  len += strlen(valstring);
                  dynValStr = (char *) realloc(dynValStr, len + 1); /* increase size */
                  strcat(dynValStr, valstring);     /* append the continued chars */
               }
               if (*comstring)
               {
                  /* concantenate comment strings */
                  if (addCommDelim)
                  {
                     lenc += strlen(comstring) + 1;
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, " ");
                     strcat(dynComStr, comstring);
                  }
                  else
                  {
                     lenc += strlen(comstring);
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, comstring);                     
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = ((strlen(card) < FLEN_CARD-1) && lenc) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    /* Resetting len and lenc really shouldn't be necessary here, but
       just to make sure ... */
    len = strlen(dynValStr);
    lenc = strlen(dynComStr);
    *valuelen = len;
    *comlen = lenc;
    if (lenOnly)
       ffmaky(fptr, savedKeyPos, status);
    else
    {
       if (value)
       {
          if (firstchar <= len)
             strncat(value,dynValStr+firstchar-1,maxvalchar);
       }
       if (comm)
       {
          strncat(comm,dynComStr,maxcomchar);
       }
    }
    
    free(dynValStr);
    free(dynComStr);
        
    return(*status);
}